

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O0

int gz_avail(gz_statep state)

{
  int iVar1;
  uInt local_3c;
  Bytef *pBStack_38;
  uint n;
  uchar *q;
  uchar *p;
  z_streamp strm;
  gz_statep pgStack_18;
  uint got;
  gz_statep state_local;
  
  if ((state->err == 0) || (state->err == -5)) {
    if (state->eof == 0) {
      if ((state->strm).avail_in != 0) {
        local_3c = (state->strm).avail_in;
        pBStack_38 = (state->strm).next_in;
        q = state->in;
        do {
          *q = *pBStack_38;
          local_3c = local_3c - 1;
          pBStack_38 = pBStack_38 + 1;
          q = q + 1;
        } while (local_3c != 0);
      }
      pgStack_18 = state;
      iVar1 = gz_load(state,state->in + (state->strm).avail_in,state->size - (state->strm).avail_in,
                      (uint *)((long)&strm + 4));
      if (iVar1 == -1) {
        return -1;
      }
      (state->strm).avail_in = strm._4_4_ + (state->strm).avail_in;
      (state->strm).next_in = pgStack_18->in;
    }
    state_local._4_4_ = 0;
  }
  else {
    state_local._4_4_ = -1;
  }
  return state_local._4_4_;
}

Assistant:

local int gz_avail(state)
    gz_statep state;
{
    unsigned got;
    z_streamp strm = &(state->strm);

    if (state->err != Z_OK && state->err != Z_BUF_ERROR)
        return -1;
    if (state->eof == 0) {
        if (strm->avail_in) {       /* copy what's there to the start */
            unsigned char *p = state->in;
            unsigned const char *q = strm->next_in;
            unsigned n = strm->avail_in;
            do {
                *p++ = *q++;
            } while (--n);
        }
        if (gz_load(state, state->in + strm->avail_in,
                    state->size - strm->avail_in, &got) == -1)
            return -1;
        strm->avail_in += got;
        strm->next_in = state->in;
    }
    return 0;
}